

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lca_test.cpp
# Opt level: O0

void __thiscall LCA_BenchmarkN100000Q100000_Test::TestBody(LCA_BenchmarkN100000Q100000_Test *this)

{
  int iVar1;
  int iVar2;
  undefined4 local_1c;
  int i;
  int q;
  int n;
  LCA_BenchmarkN100000Q100000_Test *this_local;
  
  srand(1);
  generateTree(100000);
  initLCA(0,100000);
  for (local_1c = 0; local_1c < 100000; local_1c = local_1c + 1) {
    iVar1 = rand();
    iVar2 = rand();
    lca(iVar1 % 100000,iVar2 % 100000);
  }
  return;
}

Assistant:

TEST(LCA, BenchmarkN100000Q100000) {
    srand(1);
    int n = 100000;
    int q = 100000;
    generateTree(n);
    initLCA(0, n);
    rep(i, 0, q) {
        lca(rand() % n, rand() % n);
    }
}